

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

WebPEncodingError
VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main,int use_cache)

{
  undefined8 *puVar1;
  int *piVar2;
  WebPConfig *pWVar3;
  WebPPicture *pic;
  WebPAuxStats *pWVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  WebPWorker *pWVar12;
  WebPWorker *pWVar13;
  WebPWorker *pWVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  VP8LEncoder *enc;
  WebPWorkerInterface *pWVar19;
  uint32_t *ptr;
  double *pdVar20;
  byte bVar21;
  int iVar22;
  int iVar23;
  undefined4 uVar24;
  WebPWorker *pWVar25;
  WebPEncodingError WVar26;
  uint uVar27;
  undefined1 *puVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint *puVar35;
  ulong uVar36;
  uint *puVar37;
  uint uVar38;
  uint uVar39;
  uint32_t *palette;
  uint32_t *array;
  uint uVar40;
  long lVar41;
  float fVar42;
  VP8LBitWriter bw_side;
  WebPWorker worker_side;
  WebPWorker worker_main;
  StreamEncodeContext params_main;
  StreamEncodeContext params_side;
  WebPAuxStats stats_side;
  VP8LEncoder *local_4f0;
  VP8LBitWriter local_498;
  WebPWorker local_468;
  WebPWorker local_438;
  double local_408 [2];
  VP8LBitWriter *local_3f8;
  VP8LEncoder *local_3f0;
  undefined8 uStack_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  int local_304;
  WebPEncodingError local_2fc;
  WebPAuxStats *local_2f8;
  uint local_2e8 [2];
  undefined1 auStack_2e0 [12];
  undefined8 uStack_2d4;
  undefined4 local_2cc;
  uint local_2c8 [48];
  double local_208 [2];
  VP8LBitWriter *local_1f8;
  VP8LEncoder *pVStack_1f0;
  undefined1 local_1e8 [12];
  undefined1 auStack_1dc [12];
  undefined8 auStack_1d0 [25];
  uint local_104;
  undefined4 local_fc;
  WebPAuxStats *local_f8;
  WebPAuxStats local_ec;
  
  enc = VP8LEncoderNew(config,picture);
  pWVar19 = WebPGetWorkerInterface();
  if (enc == (VP8LEncoder *)0x0) {
LAB_001409e0:
    local_4f0 = (VP8LEncoder *)0x0;
  }
  else {
    pWVar3 = enc->config_;
    pic = enc->pic_;
    uVar27 = pic->width;
    iVar17 = pic->height;
    iVar18 = pWVar3->method;
    palette = enc->palette_sorted_;
    iVar15 = WebPGetColorPalette(pic,palette);
    enc->palette_size_ = iVar15;
    if (iVar15 < 0x101) {
      qsort(palette,(long)iVar15,4,PaletteCompareColorsForQsort);
      iVar30 = 9;
    }
    else {
      enc->palette_size_ = 0;
      iVar30 = 7;
    }
    puVar35 = local_2e8 + 1;
    uVar32 = iVar30 - iVar18;
    do {
      uVar33 = uVar32;
      bVar21 = (byte)uVar33;
      iVar30 = 1 << (bVar21 & 0x1f);
      uVar32 = uVar33 + 1;
    } while (0xa28 < (int)(((uint)(iVar30 + pic->height + -1) >> (bVar21 & 0x1f)) *
                          ((uint)(pic->width + -1 + iVar30) >> (bVar21 & 0x1f))));
    uVar32 = 6;
    if (3 < iVar18) {
      uVar32 = iVar18 == 4 | 4;
    }
    uVar39 = 9;
    if ((int)uVar33 < 9) {
      uVar39 = uVar33;
    }
    uVar33 = 2;
    if (2 < (int)uVar39) {
      uVar33 = uVar39;
    }
    if (uVar33 <= uVar32) {
      uVar32 = uVar33;
    }
    enc->histo_bits_ = uVar33;
    enc->transform_bits_ = uVar32;
    if (iVar18 == 0) {
      local_2e8[0] = (iVar15 < 0x101) + 3;
      uVar27 = (uint)(0x100 < iVar15) * 3;
      uVar11 = 0;
      uVar32 = 1;
      uVar24 = 0;
      uVar36 = 1;
LAB_00140453:
      *puVar35 = uVar27;
LAB_001405df:
      puVar28 = auStack_2e0 + 4;
      uVar31 = 0;
      do {
        uVar34 = 0;
        do {
          *(uint *)(puVar28 + uVar34 * 8 + -4) = 4 - (uint)(uVar34 == 0);
          *(undefined4 *)(puVar28 + uVar34 * 8) = uVar24;
          uVar34 = uVar34 + 1;
        } while (uVar36 != uVar34);
        *(int *)((long)&uStack_2d4 + uVar31 * 0x1c + 4) = (int)uVar36;
        uVar31 = uVar31 + 1;
        puVar28 = puVar28 + 0x1c;
      } while (uVar31 != uVar32);
    }
    else {
      iVar30 = enc->palette_size_;
      uVar11 = 1;
      uVar33 = (iVar30 < 0x11) + 1;
      if (iVar30 < 1) {
        uVar33 = 1;
      }
      uVar39 = 4;
      if (0x100 < iVar15 || iVar30 >= 0x11) {
        puVar35 = pic->argb;
        iVar23 = pic->argb_stride;
        ptr = (uint32_t *)WebPSafeCalloc(0xd,0x400);
        if (ptr == (uint32_t *)0x0) {
          WVar26 = VP8_ENC_ERROR_OUT_OF_MEMORY;
          local_4f0 = (VP8LEncoder *)0x0;
          goto LAB_001409e8;
        }
        if (0 < iVar17) {
          uVar39 = *puVar35;
          iVar22 = 0;
          puVar37 = (uint *)0x0;
          do {
            if (0 < (int)uVar27) {
              uVar36 = 0;
              uVar16 = uVar39;
              do {
                uVar39 = puVar35[uVar36];
                uVar38 = (uVar39 | 0xff0000) - (uVar16 & 0xff00ff00);
                uVar16 = (uVar39 | 0xff00) - (uVar16 & 0xff00ff);
                uVar40 = uVar16 & 0xff00ff | uVar38 & 0xff00ff00;
                if ((uVar40 != 0) && ((puVar37 == (uint *)0x0 || (uVar39 != puVar37[uVar36])))) {
                  ptr[uVar39 >> 0x18] = ptr[uVar39 >> 0x18] + 1;
                  piVar2 = (int *)((long)ptr + (ulong)(uVar39 >> 0xe & 0x3fc) + 0x1000);
                  *piVar2 = *piVar2 + 1;
                  ptr[(ulong)(uVar39 >> 8 & 0xff) + 0x200] =
                       ptr[(ulong)(uVar39 >> 8 & 0xff) + 0x200] + 1;
                  ptr[(ulong)(uVar39 & 0xff) + 0x600] = ptr[(ulong)(uVar39 & 0xff) + 0x600] + 1;
                  ptr[(ulong)(uVar38 >> 0x18) + 0x100] = ptr[(ulong)(uVar38 >> 0x18) + 0x100] + 1;
                  piVar2 = (int *)((long)ptr + (ulong)((uVar16 & 0xff0000) >> 0xe) + 0x1400);
                  *piVar2 = *piVar2 + 1;
                  ptr[(ulong)(uVar38 >> 8 & 0xff) + 0x300] =
                       ptr[(ulong)(uVar38 >> 8 & 0xff) + 0x300] + 1;
                  ptr[(ulong)(uVar16 & 0xff) + 0x700] = ptr[(ulong)(uVar16 & 0xff) + 0x700] + 1;
                  ptr[(ulong)((uVar39 >> 0x10) - ((int)uVar39 >> 8) & 0xff) + 0x800] =
                       ptr[(ulong)((uVar39 >> 0x10) - ((int)uVar39 >> 8) & 0xff) + 0x800] + 1;
                  ptr[(ulong)(uVar39 - ((int)uVar39 >> 8) & 0xff) + 0xa00] =
                       ptr[(ulong)(uVar39 - ((int)uVar39 >> 8) & 0xff) + 0xa00] + 1;
                  ptr[(ulong)((uVar40 >> 0x10) - ((int)uVar40 >> 8) & 0xff) + 0x900] =
                       ptr[(ulong)((uVar40 >> 0x10) - ((int)uVar40 >> 8) & 0xff) + 0x900] + 1;
                  ptr[(ulong)(uVar16 - ((int)uVar40 >> 8) & 0xff) + 0xb00] =
                       ptr[(ulong)(uVar16 - ((int)uVar40 >> 8) & 0xff) + 0xb00] + 1;
                  piVar2 = (int *)((long)ptr +
                                  (ulong)(((uVar39 >> 0x13) + uVar39) * 0x39c5fba7 >> 0x16 &
                                         0xfffffffc) + 0x3000);
                  *piVar2 = *piVar2 + 1;
                }
                uVar36 = uVar36 + 1;
                uVar16 = uVar39;
              } while (uVar27 != uVar36);
            }
            iVar22 = iVar22 + 1;
            puVar37 = puVar35;
            puVar35 = puVar35 + iVar23;
          } while (iVar22 != iVar17);
        }
        ptr[0x900] = ptr[0x900] + 1;
        ptr[0xb00] = ptr[0xb00] + 1;
        ptr[0x500] = ptr[0x500] + 1;
        ptr[0x300] = ptr[0x300] + 1;
        ptr[0x700] = ptr[0x700] + 1;
        ptr[0x100] = ptr[0x100] + 1;
        lVar41 = 0;
        array = ptr;
        do {
          dVar5 = VP8LBitsEntropy(array,0x100);
          local_408[lVar41] = dVar5;
          lVar41 = lVar41 + 1;
          array = array + 0x100;
        } while (lVar41 != 0xd);
        bVar21 = (byte)uVar32;
        iVar23 = 1 << (bVar21 & 0x1f);
        fVar42 = (float)(((iVar23 + iVar17) - 1U >> (bVar21 & 0x1f)) *
                        ((uVar27 + iVar23) - 1 >> (bVar21 & 0x1f)));
        local_208[0] = (double)local_3f8 + uStack_3e8 + local_408[0] + local_3d8;
        local_208[1] = local_3d0 + (double)local_3f0 + local_3e0 + local_408[1] +
                       (double)(fVar42 * 3.807355);
        local_1f8 = (VP8LBitWriter *)((double)local_3f8 + local_408[0] + local_3c8 + local_3b8);
        pVStack_1f0 = (VP8LEncoder *)
                      (dStack_3b0 + (double)local_3f0 + local_408[1] + dStack_3c0 +
                      (double)(fVar42 * 4.5849624));
        local_1e8._0_8_ = (double)(iVar30 << 3) + local_3a8;
        uVar36 = 1;
        uVar39 = 0;
        uVar27 = 0 >> (bVar21 & 0x1f);
        do {
          uVar31 = uVar36 & 0xffffffff;
          uVar32 = (uint)uVar36;
          if (local_208[uVar27] < local_208[uVar36] || local_208[uVar27] == local_208[uVar36]) {
            uVar31 = (ulong)uVar39;
            uVar32 = uVar27;
          }
          uVar27 = uVar32;
          uVar36 = uVar36 + 1;
          uVar39 = (uint)uVar31;
        } while (((ulong)(iVar15 < 0x101) | 4) != uVar36);
        lVar41 = 1;
        do {
          if (ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar31 * 2 + 1] * 0x100 + lVar41] != 0 ||
              ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar31 * 2] * 0x100 + lVar41] != 0) {
            uVar11 = 0;
            goto LAB_00140470;
          }
          lVar41 = lVar41 + 1;
        } while (lVar41 != 0x100);
        uVar11 = 1;
LAB_00140470:
        WebPSafeFree(ptr);
      }
      puVar35 = local_2c8;
      uVar36 = (ulong)uVar33;
      fVar42 = pWVar3->quality;
      if (((iVar18 != 6) || (fVar42 != 100.0)) || (NAN(fVar42))) {
        local_2e8[1] = (uint)(0x100 < iVar15) * 2 + 1;
        local_2e8[0] = uVar39;
        if (iVar18 != 5 || fVar42 < 75.0) {
          uVar24 = 0;
        }
        else {
          if (uVar39 == 4) {
            local_2cc = 5;
            uVar32 = 2;
            uVar27 = 1;
            uVar24 = 1;
            goto LAB_00140453;
          }
          uVar24 = 1;
        }
        uVar32 = 1;
        goto LAB_001405df;
      }
      uVar32 = 0;
      uVar27 = 0;
      uVar33 = 0;
      do {
        if (iVar15 < 0x101 || uVar33 < 4) {
          local_2e8[(long)(int)uVar27 * 7] = uVar33;
          uVar24 = 3;
          uVar27 = uVar32;
          if ((uVar33 & 6) == 4 && iVar15 < 0x101) {
            uVar27 = uVar32 + 1;
            local_2e8[(long)(int)uVar27 * 7] = uVar33;
            *(undefined4 *)(auStack_2e0 + (long)(int)uVar27 * 0x1c + -4) = 2;
            uVar24 = 1;
          }
          *(undefined4 *)(auStack_2e0 + (long)(int)uVar32 * 0x1c + -4) = uVar24;
          uVar27 = uVar27 + 1;
          uVar32 = uVar27;
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != 6);
      uVar24 = 1;
      if (0 < (int)uVar32) goto LAB_001405df;
    }
    iVar17 = EncoderInit(enc);
    if (iVar17 == 0) goto LAB_001409e0;
    uVar27 = 0;
    iVar17 = VP8LBitWriterInit(&local_498,0);
    if (iVar17 == 0) goto LAB_001409e0;
    if (0 < config->thread_level) {
      uVar27 = (int)uVar32 / 2;
      uVar36 = (ulong)uVar27;
      local_104 = uVar27;
      if (1 < (int)uVar32) {
        lVar41 = (long)(int)uVar32 * 0x1c + (long)(int)uVar27 * -0x1c;
        lVar29 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_2e8 + lVar29 + lVar41);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          uVar10 = *(undefined8 *)((long)(auStack_2e0 + lVar29 + lVar41 + 4) + 8);
          *(undefined8 *)(auStack_1dc + lVar29 + 4) =
               *(undefined8 *)(auStack_2e0 + lVar29 + lVar41 + 4);
          *(undefined8 *)((long)auStack_1d0 + lVar29) = uVar10;
          *(undefined8 *)(local_1e8 + lVar29 + 4) = uVar8;
          *(undefined8 *)(auStack_1dc + lVar29) = uVar9;
          lVar29 = lVar29 + 0x1c;
          uVar36 = uVar36 - 1;
        } while (uVar36 != 0);
      }
    }
    if (uVar32 - uVar27 != 0 && (int)uVar27 <= (int)uVar32) {
      memcpy((void *)((long)&uStack_3e8 + 4),local_2e8,(ulong)(uVar32 + ~uVar27) * 0x1c + 0x1c);
    }
    bVar7 = true;
    local_4f0 = (VP8LEncoder *)0x0;
    local_304 = uVar32 - uVar27;
    do {
      bVar6 = !bVar7;
      pWVar25 = &local_468;
      if (!bVar6) {
        pWVar25 = &local_438;
      }
      pdVar20 = local_208;
      if (!bVar6) {
        pdVar20 = local_408;
      }
      *pdVar20 = (double)config;
      pdVar20[1] = (double)picture;
      *(int *)(pdVar20 + 4) = use_cache;
      *(undefined4 *)(pdVar20 + 0x21) = uVar11;
      pWVar4 = picture->stats;
      if (bVar6) {
        local_f8 = pWVar4;
        if (pWVar4 != (WebPAuxStats *)0x0) {
          local_f8 = &local_ec;
        }
        iVar17 = VP8LBitWriterClone(bw_main,&local_498);
        if (iVar17 == 0) goto LAB_001409e3;
        local_1f8 = &local_498;
        local_4f0 = VP8LEncoderNew(config,picture);
        if (local_4f0 == (VP8LEncoder *)0x0) goto LAB_001409e0;
        iVar17 = EncoderInit(local_4f0);
        if (iVar17 == 0) goto LAB_001409e3;
        iVar17 = enc->transform_bits_;
        local_4f0->histo_bits_ = enc->histo_bits_;
        local_4f0->transform_bits_ = iVar17;
        local_4f0->palette_size_ = enc->palette_size_;
        memcpy(local_4f0->palette_,enc->palette_,0x400);
        memcpy(local_4f0->palette_sorted_,palette,0x400);
        pWVar12 = &local_468;
        pWVar13 = &local_468;
        pWVar14 = &local_468;
        pVStack_1f0 = local_4f0;
      }
      else {
        pWVar12 = &local_438;
        pWVar13 = &local_438;
        pWVar14 = &local_438;
        local_3f8 = bw_main;
        local_3f0 = enc;
        local_2f8 = pWVar4;
      }
      (*pWVar19->Init)(pWVar25);
      pWVar12->data1 = pdVar20;
      pWVar13->data2 = (void *)0x0;
      pWVar14->hook = EncodeStreamHook;
      bVar6 = (bool)(0 < (int)uVar27 & bVar7);
      bVar7 = false;
    } while (bVar6);
    if (uVar27 == 0) {
LAB_00140920:
      (*pWVar19->Execute)(&local_438);
      iVar17 = (*pWVar19->Sync)(&local_438);
      (*pWVar19->End)(&local_438);
      if (uVar27 == 0) {
        WVar26 = VP8_ENC_OK;
        if (iVar17 == 0) {
          WVar26 = local_2fc;
        }
      }
      else {
        iVar18 = (*pWVar19->Sync)(&local_468);
        (*pWVar19->End)(&local_468);
        if ((iVar17 == 0) || (iVar18 == 0)) {
          pdVar20 = local_408;
          if (iVar17 != 0) {
            pdVar20 = local_208;
          }
          WVar26 = *(WebPEncodingError *)((long)pdVar20 + 0x10c);
        }
        else {
          WVar26 = VP8_ENC_OK;
          if (local_498.cur_ + ((long)(local_498.used_ + 7 >> 3) - (long)local_498.buf_) <
              bw_main->cur_ + ((long)(bw_main->used_ + 7 >> 3) - (long)bw_main->buf_)) {
            VP8LBitWriterSwap(bw_main,&local_498);
            WVar26 = VP8_ENC_OK;
            if (picture->stats != (WebPAuxStats *)0x0) {
              memcpy(picture->stats,&local_ec,0xbc);
            }
          }
        }
      }
      goto LAB_001409e8;
    }
    iVar17 = (*pWVar19->Reset)(&local_468);
    if (iVar17 != 0) {
      if (picture->stats != (WebPAuxStats *)0x0) {
        memcpy(&local_ec,picture->stats,0xbc);
      }
      local_fc = 0;
      (*pWVar19->Launch)(&local_468);
      goto LAB_00140920;
    }
  }
LAB_001409e3:
  WVar26 = VP8_ENC_ERROR_OUT_OF_MEMORY;
LAB_001409e8:
  VP8LBitWriterWipeOut(&local_498);
  VP8LEncoderDelete(enc);
  VP8LEncoderDelete(local_4f0);
  return WVar26;
}

Assistant:

WebPEncodingError VP8LEncodeStream(const WebPConfig* const config,
                                   const WebPPicture* const picture,
                                   VP8LBitWriter* const bw_main,
                                   int use_cache) {
  WebPEncodingError err = VP8_ENC_OK;
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  // Analyze image (entropy, num_palettes etc)
  if (enc_main == NULL ||
      !EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main) || !VP8LBitWriterInit(&bw_side, 0)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs_[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs_ = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs_[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs_ = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config_ = config;
      param->picture_ = picture;
      param->use_cache_ = use_cache;
      param->red_and_blue_always_zero_ = red_and_blue_always_zero;
      if (idx == 0) {
        param->stats_ = picture->stats;
        param->bw_ = bw_main;
        param->enc_ = enc_main;
      } else {
        param->stats_ = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        param->bw_ = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, picture);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits_ = enc_main->histo_bits_;
        enc_side->transform_bits_ = enc_main->transform_bits_;
        enc_side->palette_size_ = enc_main->palette_size_;
        memcpy(enc_side->palette_, enc_main->palette_,
               sizeof(enc_main->palette_));
        memcpy(enc_side->palette_sorted_, enc_main->palette_sorted_,
               sizeof(enc_main->palette_sorted_));
        param->enc_ = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      err = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    // This line is only useful to remove a Clang static analyzer warning.
    params_side.err_ = VP8_ENC_OK;
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      err = ok_main ? params_side.err_ : params_main.err_;
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  } else {
    if (!ok_main) {
      err = params_main.err_;
      goto Error;
    }
  }

Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return err;
}